

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void get_quantize_error(MACROBLOCK *x,int plane,tran_low_t *coeff,tran_low_t *qcoeff,
                       tran_low_t *dqcoeff,TX_SIZE tx_size,uint16_t *eob,int64_t *recon_error,
                       int64_t *sse)

{
  sbyte sVar1;
  int iVar2;
  int iVar3;
  uint16_t *eob_ptr;
  MACROBLOCKD *xd_00;
  int64_t iVar4;
  MACROBLOCK_PLANE *in_RCX;
  tran_low_t *in_RDX;
  int in_ESI;
  long in_RDI;
  tran_low_t *in_R8;
  byte in_R9B;
  long *in_stack_00000010;
  int64_t *in_stack_00000018;
  QUANT_PARAM quant_param;
  int shift;
  int pix_num;
  SCAN_ORDER *scan_order;
  MACROBLOCKD *xd;
  macroblock_plane *p;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  int64_t local_88;
  long local_80;
  SCAN_ORDER (*eob_ptr_00) [16];
  undefined7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  eob_ptr = (uint16_t *)(in_RDI + (long)in_ESI * 0x88);
  xd_00 = (MACROBLOCKD *)(in_RDI + 0x1a0);
  eob_ptr_00 = av1_scan_orders + in_R9B;
  iVar2 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                [txsize_to_bsize[in_R9B]] & 0x1f);
  sVar1 = 2;
  if (in_R9B == 3) {
    sVar1 = 0;
  }
  av1_setup_quant((TX_SIZE)((ulong)in_stack_ffffffffffffff70 >> 0x38),(int)in_stack_ffffffffffffff70
                  ,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                  (QUANT_PARAM *)0x327998);
  iVar3 = is_cur_buf_hbd(xd_00);
  if (iVar3 == 0) {
    av1_quantize_fp_facade
              ((tran_low_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(intptr_t)in_RDX,in_RCX,
               in_R8,(tran_low_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),eob_ptr,
               (SCAN_ORDER *)quant_param.iqmatrix,(QUANT_PARAM *)quant_param._24_8_);
    iVar4 = (*av1_block_error)(in_RDX,in_R8,(long)iVar2,in_stack_00000018);
    *in_stack_00000010 = iVar4 >> sVar1;
  }
  else {
    av1_highbd_quantize_fp_facade
              ((tran_low_t *)in_RCX,(intptr_t)in_R8,
               (MACROBLOCK_PLANE *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),(tran_low_t *)eob_ptr,
               &xd_00->mi_row,(uint16_t *)eob_ptr_00,(SCAN_ORDER *)quant_param._0_8_,
               (QUANT_PARAM *)quant_param.qmatrix);
    iVar4 = (*av1_highbd_block_error)(in_RDX,in_R8,(long)iVar2,in_stack_00000018,xd_00->bd);
    *in_stack_00000010 = iVar4 >> sVar1;
  }
  if (*in_stack_00000010 < 2) {
    local_80 = 1;
  }
  else {
    local_80 = *in_stack_00000010;
  }
  *in_stack_00000010 = local_80;
  *in_stack_00000018 = *in_stack_00000018 >> sVar1;
  if (*in_stack_00000018 < 2) {
    local_88 = 1;
  }
  else {
    local_88 = *in_stack_00000018;
  }
  *in_stack_00000018 = local_88;
  return;
}

Assistant:

static inline void get_quantize_error(const MACROBLOCK *x, int plane,
                                      const tran_low_t *coeff,
                                      tran_low_t *qcoeff, tran_low_t *dqcoeff,
                                      TX_SIZE tx_size, uint16_t *eob,
                                      int64_t *recon_error, int64_t *sse) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const MACROBLOCKD *xd = &x->e_mbd;
  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
  int pix_num = 1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]];
  const int shift = tx_size == TX_32X32 ? 0 : 2;

  QUANT_PARAM quant_param;
  av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_FP, 0, &quant_param);

#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    av1_highbd_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, eob,
                                  scan_order, &quant_param);
    *recon_error =
        av1_highbd_block_error(coeff, dqcoeff, pix_num, sse, xd->bd) >> shift;
  } else {
    av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, eob, scan_order,
                           &quant_param);
    *recon_error = av1_block_error(coeff, dqcoeff, pix_num, sse) >> shift;
  }
#else
  (void)xd;
  av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, eob, scan_order,
                         &quant_param);
  *recon_error = av1_block_error(coeff, dqcoeff, pix_num, sse) >> shift;
#endif  // CONFIG_AV1_HIGHBITDEPTH

  *recon_error = AOMMAX(*recon_error, 1);

  *sse = (*sse) >> shift;
  *sse = AOMMAX(*sse, 1);
}